

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VariableBase.cpp
# Opt level: O2

void __thiscall
adios2::core::VariableBase::CheckRandomAccessConflict(VariableBase *this,string *hint)

{
  allocator local_d3;
  allocator local_d2;
  allocator local_d1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  string local_50;
  string local_30;
  
  if ((this->m_RandomAccess == true) && (this->m_FirstStreamingStep == false)) {
    std::__cxx11::string::string((string *)&local_30,"Core",&local_d1);
    std::__cxx11::string::string((string *)&local_50,"VariableBase",&local_d2);
    std::__cxx11::string::string((string *)&local_70,"CheckRandomAccessConflict",&local_d3);
    std::operator+(&local_d0,
                   "can\'t mix streaming and random-access (call to SetStepSelection)for variable ",
                   &this->m_Name);
    std::operator+(&local_b0,&local_d0,", ");
    std::operator+(&local_90,&local_b0,hint);
    helper::Throw<std::invalid_argument>(&local_30,&local_50,&local_70,&local_90,-1);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_30);
  }
  return;
}

Assistant:

void VariableBase::CheckRandomAccessConflict(const std::string hint) const
{
    if (m_RandomAccess && !m_FirstStreamingStep)
    {
        helper::Throw<std::invalid_argument>("Core", "VariableBase", "CheckRandomAccessConflict",
                                             "can't mix streaming and "
                                             "random-access (call to SetStepSelection)"
                                             "for variable " +
                                                 m_Name + ", " + hint);
    }
}